

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

int __thiscall
unodb::detail::
olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::init(olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
       *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  optimistic_lock *lock_;
  undefined7 extraout_var;
  ulong uVar2;
  write_guard *in_RCX;
  olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *in_RDX;
  uint8_t in_R8B;
  write_guard *in_R9;
  write_guard *child_guard_local;
  uint8_t child_to_delete_local;
  write_guard *source_node_guard_local;
  inode_256_type *source_node_local;
  db_type *db_instance_local;
  olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_local;
  
  lock_ = lock<unodb::detail::olc_inode_256<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                    (in_RDX);
  bVar1 = optimistic_lock::write_guard::guards(in_RCX,lock_);
  if (!bVar1) {
    __assert_fail("source_node_guard.guards(lock(source_node))",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x57c,
                  "void unodb::detail::olc_inode_48<std::span<const std::byte>, std::span<const std::byte>>::init(db_type &, inode_256_type &, unodb::optimistic_lock::write_guard &, std::uint8_t, unodb::optimistic_lock::write_guard &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                 );
  }
  bVar1 = optimistic_lock::write_guard::active(in_R9);
  if (!bVar1) {
    __assert_fail("child_guard.active()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x57d,
                  "void unodb::detail::olc_inode_48<std::span<const std::byte>, std::span<const std::byte>>::init(db_type &, inode_256_type &, unodb::optimistic_lock::write_guard &, std::uint8_t, unodb::optimistic_lock::write_guard &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                 );
  }
  obsolete<unodb::detail::olc_inode_256<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
            (in_RDX,in_RCX);
  obsolete_child_by_index(in_R8B,in_R9);
  basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  ::init(&this->super_olc_inode_48_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>,
         ctx);
  bVar1 = optimistic_lock::write_guard::active(in_RCX);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!source_node_guard.active()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x582,
                  "void unodb::detail::olc_inode_48<std::span<const std::byte>, std::span<const std::byte>>::init(db_type &, inode_256_type &, unodb::optimistic_lock::write_guard &, std::uint8_t, unodb::optimistic_lock::write_guard &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                 );
  }
  bVar1 = optimistic_lock::write_guard::active(in_R9);
  uVar2 = CONCAT71(extraout_var,bVar1) ^ 0xff;
  if ((uVar2 & 1) == 0) {
    __assert_fail("!child_guard.active()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x583,
                  "void unodb::detail::olc_inode_48<std::span<const std::byte>, std::span<const std::byte>>::init(db_type &, inode_256_type &, unodb::optimistic_lock::write_guard &, std::uint8_t, unodb::optimistic_lock::write_guard &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                 );
  }
  return (int)uVar2;
}

Assistant:

void olc_inode_48<Key, Value>::init(
    db_type& db_instance, inode_256_type& source_node,
    unodb::optimistic_lock::write_guard& source_node_guard,
    std::uint8_t child_to_delete,
    unodb::optimistic_lock::write_guard& child_guard) noexcept {
  UNODB_DETAIL_ASSERT(source_node_guard.guards(lock(source_node)));
  UNODB_DETAIL_ASSERT(child_guard.active());

  parent_class::init(db_instance, obsolete(source_node, source_node_guard),
                     obsolete_child_by_index(child_to_delete, child_guard));

  UNODB_DETAIL_ASSERT(!source_node_guard.active());
  UNODB_DETAIL_ASSERT(!child_guard.active());
}